

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFontGlyph * __thiscall ImFont::FindGlyph(ImFont *this,ImWchar c)

{
  value_type_conflict4 *pvVar1;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,c) < (this->IndexLookup).Size) {
    pvVar1 = ImVector<unsigned_short>::operator[]
                       (&this->IndexLookup,CONCAT22(in_register_00000032,c));
    if ((ulong)*pvVar1 != 0xffff) {
      return (this->Glyphs).Data + *pvVar1;
    }
  }
  return this->FallbackGlyph;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyph(ImWchar c) const
{
    if (c >= IndexLookup.Size)
        return FallbackGlyph;
    const unsigned short i = IndexLookup[c];
    if (i == (unsigned short)-1)
        return FallbackGlyph;
    return &Glyphs.Data[i];
}